

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

void fill_pointers(pixels *p,exr_coding_channel_info_t *curchan,int32_t idxoffset,void **ptr,
                  int32_t *pixelstride,int32_t *linestride)

{
  char *pcVar1;
  int iVar2;
  pointer pfVar3;
  size_t sVar4;
  sbyte sVar5;
  void **func;
  int32_t iVar6;
  
  pcVar1 = curchan->channel_name;
  func = ptr;
  iVar2 = strcmp(pcVar1,"A");
  if (iVar2 == 0) {
    pfVar3 = (pointer)(p->rgba[3].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset);
  }
  else {
    iVar2 = strcmp(pcVar1,"B");
    if (iVar2 == 0) {
      pfVar3 = (pointer)(p->rgba[2].
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + idxoffset);
    }
    else {
      iVar2 = strcmp(pcVar1,"G");
      if (iVar2 == 0) {
        pfVar3 = (pointer)(p->rgba[1].
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + idxoffset);
      }
      else {
        iVar2 = strcmp(pcVar1,"R");
        if (iVar2 == 0) {
          pfVar3 = (pointer)(p->rgba[0].
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + idxoffset);
        }
        else {
          iVar2 = strcmp(pcVar1,"H");
          if (iVar2 != 0) {
            iVar2 = strcmp(pcVar1,"F");
            if (iVar2 == 0) {
              pfVar3 = (p->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start + idxoffset;
            }
            else {
              iVar2 = strcmp(pcVar1,"I");
              if (iVar2 != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unknown channel name \'",0x16);
                pcVar1 = curchan->channel_name;
                if (pcVar1 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x365928);
                }
                else {
                  sVar4 = strlen(pcVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar1,sVar4);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'",1);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
                std::ostream::put('(');
                std::ostream::flush();
                core_test_fail("false",(char *)0x2ed,0x1854de,(char *)func);
              }
              pfVar3 = (pointer)((p->i).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + idxoffset);
            }
            sVar5 = 2;
            iVar6 = 4;
            goto LAB_00114271;
          }
          pfVar3 = (pointer)((p->h).
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + idxoffset);
        }
      }
    }
  }
  sVar5 = 1;
  iVar6 = 2;
LAB_00114271:
  *ptr = pfVar3;
  *pixelstride = iVar6;
  *linestride = p->_stride_x << sVar5;
  return;
}

Assistant:

static void
fill_pointers (
    pixels&                          p,
    const exr_coding_channel_info_t& curchan,
    int32_t                          idxoffset,
    void**                           ptr,
    int32_t*                         pixelstride,
    int32_t*                         linestride)
{
    if (!strcmp (curchan.channel_name, "A"))
    {
        *ptr         = p.rgba[3].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "B"))
    {
        *ptr         = p.rgba[2].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "G"))
    {
        *ptr         = p.rgba[1].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "R"))
    {
        *ptr         = p.rgba[0].data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "H"))
    {
        *ptr         = p.h.data () + idxoffset;
        *pixelstride = 2;
        *linestride  = 2 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "F"))
    {
        *ptr         = p.f.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else if (!strcmp (curchan.channel_name, "I"))
    {
        *ptr         = p.i.data () + idxoffset;
        *pixelstride = 4;
        *linestride  = 4 * p._stride_x;
    }
    else
    {
        std::cerr << "Unknown channel name '" << curchan.channel_name << "'"
                  << std::endl;
        EXRCORE_TEST (false);
        *ptr         = nullptr;
        *pixelstride = -1;
        *linestride  = -1;
    }
}